

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlFAGenerateCountedEpsilonTransition
              (xmlRegParserCtxtPtr ctxt,xmlRegStatePtr from,xmlRegStatePtr to,int counter)

{
  int extraout_EAX;
  
  if (to == (xmlRegStatePtr)0x0) {
    to = xmlRegStatePush(ctxt);
    if (to == (xmlRegStatePtr)0x0) {
      return 0;
    }
    ctxt->state = to;
  }
  xmlRegStateAddTrans(ctxt,from,(xmlRegAtomPtr)0x0,to,counter,-1);
  return extraout_EAX;
}

Assistant:

static int
xmlFAGenerateCountedEpsilonTransition(xmlRegParserCtxtPtr ctxt,
	    xmlRegStatePtr from, xmlRegStatePtr to, int counter) {
    if (to == NULL) {
	to = xmlRegStatePush(ctxt);
        if (to == NULL)
            return(-1);
	ctxt->state = to;
    }
    xmlRegStateAddTrans(ctxt, from, NULL, to, counter, -1);
    return(0);
}